

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O1

void process_event(helix_session_t session,helix_event_t event)

{
  helix_event_mask_t hVar1;
  helix_trading_state_t hVar2;
  helix_order_book_t ob;
  helix_timestamp_t hVar3;
  char *pcVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  size_t level;
  
  hVar1 = helix_event_mask(event);
  if ((hVar1 & HELIX_EVENT_ORDER_BOOK_UPDATE) != 0) {
    ob = helix_event_order_book(event);
    hVar3 = helix_order_book_timestamp(ob);
    hVar2 = helix_order_book_state(ob);
    if (hVar2 == HELIX_TRADING_STATE_TRADING) {
      uVar7 = (hVar3 / 3600000) * -0xe10 + hVar3 / 1000;
      werase(_stdscr);
      wmove(_stdscr,0,0);
      pcVar4 = helix_event_symbol(event);
      printw("%16s    %02lu:%02lu:%02lu.%03lu\n",pcVar4,hVar3 / 3600000,uVar7 / 0x3c,uVar7 % 0x3c,
             hVar3 % 1000);
      level = 0;
      do {
        uVar7 = level + 1;
        wmove(_stdscr,uVar7 & 0xffffffff,0);
        uVar5 = helix_order_book_bid_size(ob,level);
        helix_order_book_bid_price(ob,level);
        helix_order_book_ask_price(ob,level);
        uVar6 = helix_order_book_ask_size(ob,level);
        printw("| %6lu  %.3f  %.3f  %-6lu |\n",uVar5,uVar6);
        level = uVar7;
      } while (uVar7 != 5);
      wrefresh(_stdscr);
      return;
    }
  }
  return;
}

Assistant:

static void process_event(helix_session_t session, helix_event_t event)
{
	helix_event_mask_t mask = helix_event_mask(event);

	if (mask & HELIX_EVENT_ORDER_BOOK_UPDATE) {
		print_top(event);
	}
}